

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

int Sfm_LibImplementGatesDelay
              (Sfm_Lib_t *p,int *pFanins,Mio_Gate_t *pGateB,Mio_Gate_t *pGateT,char *pFansB,
              char *pFansT,Vec_Int_t *vGates,Vec_Wec_t *vFanins)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = Mio_GateReadValue(pGateB);
  Vec_IntPush(vGates,iVar1);
  pVVar3 = Vec_WecPushLevel(vFanins);
  uVar2 = Mio_GateReadPinNum(pGateB);
  uVar5 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    Vec_IntPush(pVVar3,pFanins[pFansB[uVar5]]);
  }
  if (pGateT == (Mio_Gate_t *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = Mio_GateReadValue(pGateT);
    Vec_IntPush(vGates,iVar1);
    pVVar3 = Vec_WecPushLevel(vFanins);
    uVar2 = Mio_GateReadPinNum(pGateT);
    uVar5 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      if ((long)pFansT[uVar5] == 0x10) {
        iVar1 = vFanins->nSize + -2;
      }
      else {
        iVar1 = pFanins[pFansT[uVar5]];
      }
      Vec_IntPush(pVVar3,iVar1);
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int Sfm_LibImplementGatesDelay( Sfm_Lib_t * p, int * pFanins, Mio_Gate_t * pGateB, Mio_Gate_t * pGateT, char * pFansB, char * pFansT, Vec_Int_t * vGates, Vec_Wec_t * vFanins )
{
    Vec_Int_t * vLevel;
    int i, nFanins;
    // create bottom gate
    Vec_IntPush( vGates, Mio_GateReadValue(pGateB) );
    vLevel  = Vec_WecPushLevel( vFanins );
    nFanins = Mio_GateReadPinNum( pGateB );
    for ( i = 0; i < nFanins; i++ )
        Vec_IntPush( vLevel, pFanins[(int)pFansB[i]] );
    if ( pGateT == NULL )
        return 1;
    // create top gate
    Vec_IntPush( vGates, Mio_GateReadValue(pGateT) );
    vLevel  = Vec_WecPushLevel( vFanins );
    nFanins = Mio_GateReadPinNum( pGateT );
    for ( i = 0; i < nFanins; i++ )
        if ( pFansT[i] == (char)16 )
            Vec_IntPush( vLevel, Vec_WecSize(vFanins)-2 );
        else
            Vec_IntPush( vLevel, pFanins[(int)pFansT[i]] );
    return 2;
}